

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong __thiscall mkvparser::SegmentInfo::GetDuration(SegmentInfo *this)

{
  if (this->m_duration < 0.0) {
    return -1;
  }
  if (0 < this->m_timecodeScale) {
    return (long)(this->m_duration * (double)this->m_timecodeScale);
  }
  __assert_fail("m_timecodeScale >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                ,0xfde,"long long mkvparser::SegmentInfo::GetDuration() const");
}

Assistant:

long long SegmentInfo::GetDuration() const {
  if (m_duration < 0)
    return -1;

  assert(m_timecodeScale >= 1);

  const double dd = double(m_duration) * double(m_timecodeScale);
  const long long d = static_cast<long long>(dd);

  return d;
}